

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest20_21::iterate(FunctionalTest20_21 *this)

{
  bool bVar1;
  ContextInfo *pCVar2;
  NotSupportedError *this_00;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_468;
  undefined1 local_2e8 [8];
  program fragment_program;
  program geometry_program;
  program tesselation_evaluation_program;
  program tesselation_control_program;
  program vertex_program;
  undefined1 local_a0 [8];
  program program;
  program *program_pointers [5];
  bool local_46;
  bool result;
  allocator<char> local_31;
  string local_30;
  FunctionalTest20_21 *local_10;
  FunctionalTest20_21 *this_local;
  
  local_10 = this;
  pCVar2 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar2,"GL_ARB_shader_subroutine");
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"GL_ARB_shader_subroutine is not supported.",&local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initSharedContexts(this);
  Utils::program::program((program *)local_a0,(this->super_TestCase).m_context);
  program.m_context = (Context *)local_a0;
  prepareProgram(this,(program **)&program.m_context,false);
  bVar1 = testProgram(this,(program **)&program.m_context,false,iterate::test_cases,10);
  if (!bVar1) {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&vertex_program.m_context,pTVar4,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&vertex_program.m_context,
                        (char (*) [53])"Last error message was caused by monolithic program.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&vertex_program.m_context);
  }
  local_46 = bVar1;
  Utils::program::~program((program *)local_a0);
  pCVar2 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(pCVar2,"GL_ARB_separate_shader_objects");
  if (bVar1) {
    Utils::program::program
              ((program *)&tesselation_control_program.m_context,(this->super_TestCase).m_context);
    Utils::program::program
              ((program *)&tesselation_evaluation_program.m_context,(this->super_TestCase).m_context
              );
    Utils::program::program((program *)&geometry_program.m_context,(this->super_TestCase).m_context)
    ;
    Utils::program::program((program *)&fragment_program.m_context,(this->super_TestCase).m_context)
    ;
    Utils::program::program((program *)local_2e8,(this->super_TestCase).m_context);
    program.m_context = (Context *)local_2e8;
    prepareProgram(this,(program **)&program.m_context,true);
    bVar1 = testProgram(this,(program **)&program.m_context,true,iterate::test_cases,10);
    if (!bVar1) {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_468,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_468,
                          (char (*) [52])"Last error message was caused by separable program.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_468);
      local_46 = false;
    }
    Utils::program::~program((program *)local_2e8);
    Utils::program::~program((program *)&fragment_program.m_context);
    Utils::program::~program((program *)&geometry_program.m_context);
    Utils::program::~program((program *)&tesselation_evaluation_program.m_context);
    Utils::program::~program((program *)&tesselation_control_program.m_context);
  }
  if (local_46) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest20_21::iterate()
{
	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* Test cases, values stored here are used as bit fields */
	static const GLuint test_cases[][m_n_shared_contexts + 1] = {
		{ 0, 1, 2, 3, 4 },		{ 1, 2, 3, 4, 0 },		{ 2, 3, 4, 0, 1 },		{ 3, 4, 0, 1, 2 },
		{ 4, 0, 1, 2, 3 },		{ 27, 28, 29, 30, 31 }, { 28, 29, 30, 31, 27 }, { 29, 30, 31, 27, 28 },
		{ 30, 31, 27, 28, 29 }, { 31, 27, 28, 29, 30 },
	};
	static const GLuint n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	/* Prepare contexts */
	initSharedContexts();

	/* Test result */
	bool result = true;

	/* Program pointers */
	Utils::program* program_pointers[5];

	/* Test monolithic program */
	{
		/* Prepare program */
		Utils::program program(m_context);

		program_pointers[m_fragment_stage_index] = &program;

		prepareProgram(program_pointers, false);

		/* Execute test */
		if (false == testProgram(program_pointers, false, test_cases, n_test_cases))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Last error message was caused by monolithic program."
												<< tcu::TestLog::EndMessage;

			result = false;
		}
	}

	/* Test separable programs */
	if (true == m_context.getContextInfo().isExtensionSupported("GL_ARB_separate_shader_objects"))
	{
		/* Prepare programs */
		Utils::program vertex_program(m_context);
		Utils::program tesselation_control_program(m_context);
		Utils::program tesselation_evaluation_program(m_context);
		Utils::program geometry_program(m_context);
		Utils::program fragment_program(m_context);

		program_pointers[m_fragment_stage_index]			   = &fragment_program;
		program_pointers[m_geometry_stage_index]			   = &geometry_program;
		program_pointers[m_tesselation_control_stage_index]	= &tesselation_control_program;
		program_pointers[m_tesselation_evaluation_stage_index] = &tesselation_evaluation_program;
		program_pointers[m_vertex_stage_index]				   = &vertex_program;

		prepareProgram(program_pointers, true);

		/* Execute test */
		if (false == testProgram(program_pointers, true, test_cases, n_test_cases))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Last error message was caused by separable program."
												<< tcu::TestLog::EndMessage;
			result = false;
		}
	}

	/* All done */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return tcu::TestNode::STOP;
}